

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall
AlternativeLoader::altCheckSection(AlternativeLoader *this,string *mode,string *line)

{
  char *pcVar1;
  long lVar2;
  ulong local_30;
  unsigned_long i;
  string *line_local;
  string *mode_local;
  AlternativeLoader *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)line);
  if (*pcVar1 == '[') {
    std::__cxx11::string::operator=((string *)mode,"");
    local_30 = 1;
    while( true ) {
      lVar2 = std::__cxx11::string::size();
      if (lVar2 - 1U <= local_30) break;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)line);
      if (*pcVar1 != ']') {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)line);
        std::__cxx11::string::operator+=((string *)mode,*pcVar1);
      }
      local_30 = local_30 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AlternativeLoader::altCheckSection(std::string *mode, const std::string &line) {
    //separate in sections
    if (line[0] == *"[") {
        *mode = "";
        for (unsigned long i = 1; i < line.size() - 1; i++) {
            if(line[i] != *"]") {
                *mode += line[i];
            }
        }
        return true;
    }
    return false;
}